

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCProfile.cpp
# Opt level: O3

void Assimp::IFC::ProcessParametrizedProfile
               (IfcParameterizedProfileDef *def,TempMesh *meshout,ConversionData *conv)

{
  pointer *ppaVar1;
  pointer *ppuVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  long *plVar9;
  IfcAxis2Placement2D *in;
  size_type *psVar10;
  iterator iVar11;
  iterator __position;
  _func_int *p_Var12;
  ulong __n;
  float fVar13;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar14;
  undefined4 uVar15;
  uint uVar16;
  uint uVar17;
  undefined4 uVar18;
  uint uVar19;
  IfcMatrix4 trafo;
  allocator local_219;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined8 local_1f8;
  double dStack_1f0;
  undefined1 local_1e8 [12];
  uint uStack_1dc;
  double local_1d8;
  double local_1d0;
  double dStack_1c8;
  double local_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double local_190;
  double dStack_188;
  double local_180;
  double dStack_178;
  double local_170;
  double local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  p_Var12 = (_func_int *)
            ((long)&(def->super_IfcProfileDef).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                    _vptr_ObjectHelper +
            (long)(def->super_IfcProfileDef).
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper
                  [-3]);
  lVar8 = __dynamic_cast(p_Var12,&STEP::Object::typeinfo,
                         &Schema_2x3::IfcRectangleProfileDef::typeinfo,0xffffffffffffffff);
  if (lVar8 == 0) {
    lVar8 = __dynamic_cast(p_Var12,&STEP::Object::typeinfo,
                           &Schema_2x3::IfcCircleProfileDef::typeinfo,0xffffffffffffffff);
    if (lVar8 == 0) {
      lVar8 = __dynamic_cast(p_Var12,&STEP::Object::typeinfo,
                             &Schema_2x3::IfcIShapeProfileDef::typeinfo,0xffffffffffffffff);
      if (lVar8 == 0) {
        std::__cxx11::string::string((string *)local_48,*(char **)(p_Var12 + 0x10),&local_219);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x7353ca);
        psVar10 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_68.field_2._M_allocated_capacity = *psVar10;
          local_68.field_2._8_8_ = plVar9[3];
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        }
        else {
          local_68.field_2._M_allocated_capacity = *psVar10;
          local_68._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_68._M_string_length = plVar9[1];
        *plVar9 = (long)psVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1e8,
                   &local_68);
        LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_1e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base((ios_base *)&dStack_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        if (local_48[0] == local_38) {
          return;
        }
        operator_delete(local_48[0]);
        return;
      }
      local_208._8_8_ = 0;
      local_208._0_8_ = *(ulong *)(lVar8 + 0x88);
      local_218._8_8_ = 0;
      local_218._0_8_ = *(double *)(lVar8 + 0x80) - *(double *)(lVar8 + 0x90);
      local_1f8 = *(double *)(lVar8 + 0x98);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                (&meshout->mVerts,0xc);
      _local_1e8 = ZEXT816(0);
      local_1d8 = 0.0;
      iVar11._M_current =
           (meshout->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          (meshout->mVerts).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar11,
                   (aiVector3t<double> *)local_1e8);
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        (iVar11._M_current)->x = 0.0;
        (iVar11._M_current)->y = 0.0;
        (iVar11._M_current)->z = 0.0;
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
        (meshout->mVerts).
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar11._M_current;
      }
      uVar14 = local_218._12_4_;
      local_218._8_4_ = local_218._8_4_;
      local_218._0_8_ = local_218._0_8_ * 0.5;
      local_218._12_4_ = uVar14;
      dVar3 = *(double *)(lVar8 + 0x98);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = dVar3;
      _local_1e8 = auVar5 << 0x40;
      local_1d8 = 0.0;
      if (iVar11._M_current ==
          (meshout->mVerts).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_1f8 = local_1f8 + local_1f8;
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar11,
                   (aiVector3t<double> *)local_1e8);
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
        dVar3 = local_1f8;
      }
      else {
        (iVar11._M_current)->z = 0.0;
        (iVar11._M_current)->x = 0.0;
        (iVar11._M_current)->y = dVar3;
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
        (meshout->mVerts).
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar11._M_current;
        dVar3 = local_1f8 + local_1f8;
      }
      uVar14 = local_208._12_4_;
      local_208._8_4_ = local_208._8_4_;
      local_208._0_8_ = local_208._0_8_ - dVar3;
      local_208._12_4_ = uVar14;
      unique0x00006b80 = *(double *)(lVar8 + 0x98);
      local_1e8._0_8_ = local_218._0_8_;
      local_1d8 = 0.0;
      if (iVar11._M_current ==
          (meshout->mVerts).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar11,
                   (aiVector3t<double> *)local_1e8);
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        (iVar11._M_current)->z = 0.0;
        (iVar11._M_current)->x = (double)local_218._0_8_;
        (iVar11._M_current)->y = unique0x00006b80;
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
        (meshout->mVerts).
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar11._M_current;
      }
      unique0x10000855 = *(double *)(lVar8 + 0x98) + (double)local_208._0_8_;
      local_1e8._0_8_ = local_218._0_8_;
      local_1d8 = 0.0;
      if (iVar11._M_current ==
          (meshout->mVerts).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar11,
                   (aiVector3t<double> *)local_1e8);
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        (iVar11._M_current)->z = 0.0;
        (iVar11._M_current)->x = (double)local_218._0_8_;
        (iVar11._M_current)->y = unique0x10000855;
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
        (meshout->mVerts).
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar11._M_current;
      }
      dVar3 = *(double *)(lVar8 + 0x98) + (double)local_208._0_8_;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = dVar3;
      _local_1e8 = auVar6 << 0x40;
      local_1d8 = 0.0;
      if (iVar11._M_current ==
          (meshout->mVerts).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar11,
                   (aiVector3t<double> *)local_1e8);
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        (iVar11._M_current)->z = 0.0;
        (iVar11._M_current)->x = 0.0;
        (iVar11._M_current)->y = dVar3;
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
        (meshout->mVerts).
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar11._M_current;
      }
      dVar3 = *(double *)(lVar8 + 0x88);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar3;
      _local_1e8 = auVar7 << 0x40;
      local_1d8 = 0.0;
      if (iVar11._M_current ==
          (meshout->mVerts).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar11,
                   (aiVector3t<double> *)local_1e8);
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        (iVar11._M_current)->z = 0.0;
        (iVar11._M_current)->x = 0.0;
        (iVar11._M_current)->y = dVar3;
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
        (meshout->mVerts).
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar11._M_current;
      }
      dVar3 = *(double *)*(undefined1 (*) [16])(lVar8 + 0x80);
      dVar4 = *(double *)(lVar8 + 0x88);
      _local_1e8 = *(undefined1 (*) [16])(lVar8 + 0x80);
      local_1d8 = 0.0;
      if (iVar11._M_current ==
          (meshout->mVerts).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar11,
                   (aiVector3t<double> *)local_1e8);
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        (iVar11._M_current)->z = 0.0;
        (iVar11._M_current)->x = dVar3;
        (iVar11._M_current)->y = dVar4;
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
        (meshout->mVerts).
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar11._M_current;
      }
      local_1e8._0_8_ = *(double *)(lVar8 + 0x80);
      unique0x10000b59 = *(double *)(lVar8 + 0x98) + (double)local_208._0_8_;
      local_1d8 = 0.0;
      if (iVar11._M_current ==
          (meshout->mVerts).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar11,
                   (aiVector3t<double> *)local_1e8);
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        (iVar11._M_current)->z = 0.0;
        (iVar11._M_current)->x = (double)local_1e8._0_8_;
        (iVar11._M_current)->y = unique0x10000b59;
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
        (meshout->mVerts).
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar11._M_current;
      }
      dVar3 = (double)local_218._0_8_ + *(double *)(lVar8 + 0x90);
      dVar4 = (double)local_208._0_8_ + *(double *)(lVar8 + 0x98);
      local_1e8._8_4_ = SUB84(dVar4,0);
      local_1e8._0_8_ = dVar3;
      uStack_1dc = (int)((ulong)dVar4 >> 0x20);
      local_1d8 = 0.0;
      if (iVar11._M_current ==
          (meshout->mVerts).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar11,
                   (aiVector3t<double> *)local_1e8);
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        (iVar11._M_current)->z = 0.0;
        (iVar11._M_current)->x = dVar3;
        (iVar11._M_current)->y = local_1e8._8_8_;
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
        (meshout->mVerts).
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar11._M_current;
      }
      local_1e8._0_8_ = (double)local_218._0_8_ + *(double *)(lVar8 + 0x90);
      unique0x00006b80 = *(double *)(lVar8 + 0x98);
      local_1d8 = 0.0;
      if (iVar11._M_current ==
          (meshout->mVerts).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar11,
                   (aiVector3t<double> *)local_1e8);
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        (iVar11._M_current)->z = 0.0;
        (iVar11._M_current)->x = (double)local_1e8._0_8_;
        (iVar11._M_current)->y = unique0x00006b80;
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
        (meshout->mVerts).
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar11._M_current;
      }
      local_1e8._0_8_ = *(double *)(lVar8 + 0x80);
      unique0x00006b80 = *(double *)(lVar8 + 0x98);
      local_1d8 = 0.0;
      if (iVar11._M_current ==
          (meshout->mVerts).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar11,
                   (aiVector3t<double> *)local_1e8);
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        (iVar11._M_current)->z = 0.0;
        (iVar11._M_current)->x = (double)local_1e8._0_8_;
        (iVar11._M_current)->y = unique0x00006b80;
        iVar11._M_current =
             (meshout->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
        (meshout->mVerts).
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar11._M_current;
      }
      local_1e8._0_8_ = *(double *)(lVar8 + 0x80);
      stack0xfffffffffffffe20 = 0.0;
      local_1d8 = 0.0;
      if (iVar11._M_current ==
          (meshout->mVerts).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_realloc_insert<aiVector3t<double>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar11,
                   (aiVector3t<double> *)local_1e8);
      }
      else {
        (iVar11._M_current)->z = 0.0;
        (iVar11._M_current)->x = (double)local_1e8._0_8_;
        (iVar11._M_current)->y = 0.0;
        ppaVar1 = &(meshout->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      local_1e8._0_4_ = 0xc;
      __position._M_current =
           (meshout->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (meshout->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        *__position._M_current = 0xc;
        goto LAB_005bb113;
      }
    }
    else {
      uVar16 = conv->settings->cylindricalTessellation;
      __n = (ulong)(int)uVar16;
      local_1f8 = *(double *)(lVar8 + 0x80);
      dStack_1f0 = 0.0;
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                (&meshout->mVerts,__n);
      if ((long)__n < 0) {
        fVar13 = (float)((ulong)(uVar16 & 1) | __n >> 1);
        fVar13 = fVar13 + fVar13;
      }
      else {
        fVar13 = (float)(int)uVar16;
      }
      if (__n != 0) {
        local_70 = (double)(6.2831855 / fVar13);
        dStack_1f0 = local_1f8;
        dVar3 = 0.0;
        do {
          local_218._0_8_ = dVar3;
          dVar3 = cos(dVar3);
          local_208._8_4_ = extraout_XMM0_Dc;
          local_208._0_8_ = dVar3;
          local_208._12_4_ = extraout_XMM0_Dd;
          dVar3 = ::sin((double)local_218._0_8_);
          local_1e8._8_4_ = SUB84(dVar3 * dStack_1f0,0);
          local_1e8._0_8_ = (double)local_208._0_8_ * local_1f8;
          uStack_1dc = (int)((ulong)(dVar3 * dStack_1f0) >> 0x20);
          local_1d8 = 0.0;
          iVar11._M_current =
               (meshout->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar11._M_current ==
              (meshout->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
            _M_realloc_insert<aiVector3t<double>>
                      ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,
                       iVar11,(aiVector3t<double> *)local_1e8);
          }
          else {
            (iVar11._M_current)->z = 0.0;
            (iVar11._M_current)->x = (double)local_208._0_8_ * local_1f8;
            (iVar11._M_current)->y = stack0xfffffffffffffe20;
            ppaVar1 = &(meshout->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppaVar1 = *ppaVar1 + 1;
          }
          dVar3 = (double)local_218._0_8_ + local_70;
          __n = __n - 1;
        } while (__n != 0);
      }
      local_1e8._0_4_ = uVar16;
      __position._M_current =
           (meshout->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current !=
          (meshout->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        *__position._M_current = uVar16;
LAB_005bb113:
        ppuVar2 = &(meshout->mVertcnt).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar2 = *ppuVar2 + 1;
        goto LAB_005bb128;
      }
    }
  }
  else {
    dVar3 = *(double *)(lVar8 + 0x88) * 0.5;
    local_218._8_4_ = SUB84(dVar3,0);
    local_218._0_8_ = *(double *)(lVar8 + 0x80) * 0.5;
    local_218._12_4_ = (int)((ulong)dVar3 >> 0x20);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
              (&meshout->mVerts,
               ((long)(meshout->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(meshout->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + 4);
    _local_1e8 = local_218;
    local_1d8 = 0.0;
    iVar11._M_current =
         (meshout->mVerts).
         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (meshout->mVerts).
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      _M_realloc_insert<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar11,
                 (aiVector3t<double> *)local_1e8);
      iVar11._M_current =
           (meshout->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    else {
      (iVar11._M_current)->z = 0.0;
      (iVar11._M_current)->x = (double)local_218._0_8_;
      (iVar11._M_current)->y = (double)local_218._8_8_;
      iVar11._M_current =
           (meshout->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (meshout->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar11._M_current;
    }
    uVar14 = local_218._8_4_;
    uVar16 = local_218._12_4_;
    local_1e8._0_8_ = (ulong)local_218._0_8_ ^ 0x8000000000000000;
    local_1e8._8_4_ = uVar14;
    uStack_1dc = uVar16;
    local_1d8 = 0.0;
    if (iVar11._M_current ==
        (meshout->mVerts).
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_208._8_4_ = uVar14;
      local_208._0_8_ = local_218._8_8_;
      local_208._12_4_ = uVar16;
      local_1f8 = -local_218._0_8_;
      dStack_1f0 = -local_218._8_8_;
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      _M_realloc_insert<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar11,
                 (aiVector3t<double> *)local_1e8);
      iVar11._M_current =
           (meshout->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      uVar14 = local_208._0_4_;
      uVar16 = local_208._4_4_;
      uVar15 = local_208._8_4_;
      uVar17 = local_208._12_4_;
      uVar18 = (undefined4)local_1f8;
      uVar19 = local_1f8._4_4_;
    }
    else {
      (iVar11._M_current)->z = 0.0;
      (iVar11._M_current)->x = (double)local_1e8._0_8_;
      (iVar11._M_current)->y = stack0xfffffffffffffe20;
      iVar11._M_current =
           (meshout->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (meshout->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar11._M_current;
      uVar15 = uVar14;
      uVar17 = uVar16;
      uVar18 = local_218._0_4_;
      uVar19 = local_218._4_4_ ^ 0x80000000;
    }
    local_1e8._0_8_ = CONCAT44(uVar19,uVar18);
    unique0x100009d5 = -(double)CONCAT44(uVar16,uVar14);
    local_1d8 = 0.0;
    if (iVar11._M_current ==
        (meshout->mVerts).
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_208._0_8_ = CONCAT44(uVar16,uVar14) ^ 0x8000000000000000;
      local_208._8_4_ = uVar15;
      local_208._12_4_ = uVar17 ^ 0x80000000;
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      _M_realloc_insert<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar11,
                 (aiVector3t<double> *)local_1e8);
      iVar11._M_current =
           (meshout->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      uVar14 = local_208._0_4_;
      uVar16 = local_208._4_4_;
    }
    else {
      (iVar11._M_current)->z = 0.0;
      (iVar11._M_current)->x = (double)local_1e8._0_8_;
      (iVar11._M_current)->y = unique0x100009d5;
      iVar11._M_current =
           (meshout->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      (meshout->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar11._M_current;
      uVar16 = uVar16 ^ 0x80000000;
    }
    stack0xfffffffffffffe20 = (double)CONCAT44(uVar16,uVar14);
    local_1e8._0_8_ = local_218._0_8_;
    local_1d8 = 0.0;
    if (iVar11._M_current ==
        (meshout->mVerts).
        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      _M_realloc_insert<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)meshout,iVar11,
                 (aiVector3t<double> *)local_1e8);
    }
    else {
      (iVar11._M_current)->z = 0.0;
      (iVar11._M_current)->x = (double)local_218._0_8_;
      (iVar11._M_current)->y = (double)CONCAT44(uVar16,uVar14);
      ppaVar1 = &(meshout->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    local_1e8._0_4_ = 4;
    __position._M_current =
         (meshout->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current !=
        (meshout->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      *__position._M_current = 4;
      goto LAB_005bb113;
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&meshout->mVertcnt,__position,(uint *)local_1e8);
LAB_005bb128:
  _local_1e8 = ZEXT816(0x3ff0000000000000);
  local_1d8 = 0.0;
  local_1d0 = 0.0;
  dStack_1c8 = 0.0;
  local_1c0 = 1.0;
  local_1b8 = 0.0;
  dStack_1b0 = 0.0;
  local_1a8 = 0.0;
  dStack_1a0 = 0.0;
  local_198 = 1.0;
  local_190 = 0.0;
  dStack_188 = 0.0;
  local_180 = 0.0;
  dStack_178 = 0.0;
  local_170 = 1.0;
  in = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement2D>
                 (*(LazyObject **)&(def->super_IfcProfileDef).field_0x68);
  ConvertAxisPlacement((IfcMatrix4 *)local_1e8,in);
  TempMesh::Transform(meshout,(IfcMatrix4 *)local_1e8);
  return;
}

Assistant:

void ProcessParametrizedProfile(const Schema_2x3::IfcParameterizedProfileDef& def, TempMesh& meshout, ConversionData& conv)
{
    if(const Schema_2x3::IfcRectangleProfileDef* const cprofile = def.ToPtr<Schema_2x3::IfcRectangleProfileDef>()) {
        const IfcFloat x = cprofile->XDim*0.5f, y = cprofile->YDim*0.5f;

        meshout.mVerts.reserve(meshout.mVerts.size()+4);
        meshout.mVerts.push_back( IfcVector3( x, y, 0.f ));
        meshout.mVerts.push_back( IfcVector3(-x, y, 0.f ));
        meshout.mVerts.push_back( IfcVector3(-x,-y, 0.f ));
        meshout.mVerts.push_back( IfcVector3( x,-y, 0.f ));
        meshout.mVertcnt.push_back(4);
    }
    else if( const Schema_2x3::IfcCircleProfileDef* const circle = def.ToPtr<Schema_2x3::IfcCircleProfileDef>()) {
        if(def.ToPtr<Schema_2x3::IfcCircleHollowProfileDef>()) {
            // TODO
        }
        const size_t segments = conv.settings.cylindricalTessellation;
        const IfcFloat delta = AI_MATH_TWO_PI_F/segments, radius = circle->Radius;

        meshout.mVerts.reserve(segments);

        IfcFloat angle = 0.f;
        for(size_t i = 0; i < segments; ++i, angle += delta) {
            meshout.mVerts.push_back( IfcVector3( std::cos(angle)*radius, std::sin(angle)*radius, 0.f ));
        }

        meshout.mVertcnt.push_back(static_cast<unsigned int>(segments));
    }
    else if( const Schema_2x3::IfcIShapeProfileDef* const ishape = def.ToPtr<Schema_2x3::IfcIShapeProfileDef>()) {
        // construct simplified IBeam shape
        const IfcFloat offset = (ishape->OverallWidth - ishape->WebThickness) / 2;
        const IfcFloat inner_height = ishape->OverallDepth - ishape->FlangeThickness * 2;

        meshout.mVerts.reserve(12);
        meshout.mVerts.push_back(IfcVector3(0,0,0));
        meshout.mVerts.push_back(IfcVector3(0,ishape->FlangeThickness,0));
        meshout.mVerts.push_back(IfcVector3(offset,ishape->FlangeThickness,0));
        meshout.mVerts.push_back(IfcVector3(offset,ishape->FlangeThickness + inner_height,0));
        meshout.mVerts.push_back(IfcVector3(0,ishape->FlangeThickness + inner_height,0));
        meshout.mVerts.push_back(IfcVector3(0,ishape->OverallDepth,0));
        meshout.mVerts.push_back(IfcVector3(ishape->OverallWidth,ishape->OverallDepth,0));
        meshout.mVerts.push_back(IfcVector3(ishape->OverallWidth,ishape->FlangeThickness + inner_height,0));
        meshout.mVerts.push_back(IfcVector3(offset+ishape->WebThickness,ishape->FlangeThickness + inner_height,0));
        meshout.mVerts.push_back(IfcVector3(offset+ishape->WebThickness,ishape->FlangeThickness,0));
        meshout.mVerts.push_back(IfcVector3(ishape->OverallWidth,ishape->FlangeThickness,0));
        meshout.mVerts.push_back(IfcVector3(ishape->OverallWidth,0,0));

        meshout.mVertcnt.push_back(12);
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcParameterizedProfileDef entity, type is " + def.GetClassName());
        return;
    }

    IfcMatrix4 trafo;
    ConvertAxisPlacement(trafo, *def.Position);
    meshout.Transform(trafo);
}